

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

undefined8 Catch::Detail::StringMakerBase<true>::convert<char>(char *_value)

{
  char *in_RSI;
  undefined8 in_RDI;
  ostringstream oss;
  ostringstream local_188 [376];
  char *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,*local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }